

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

Layer * ncnn::Convolution_layer_creator(void)

{
  Convolution *this;
  
  this = (Convolution *)operator_new(0x240);
  Convolution::Convolution(this);
  return &this->super_Layer;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;
    use_int8_requantize = false;

    quantize = 0;
}